

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O3

void __thiscall FIX::FieldMap::clear(FieldMap *this)

{
  pointer pFVar1;
  pointer pFVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  FieldMap **group;
  _Base_ptr p_Var5;
  pointer pFVar6;
  
  pFVar1 = (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pFVar6 = pFVar1;
  if (pFVar2 != pFVar1) {
    do {
      (**pFVar6->_vptr_FieldBase)(pFVar6);
      pFVar6 = pFVar6 + 1;
    } while (pFVar6 != pFVar2);
    (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
    super__Vector_impl_data._M_finish = pFVar1;
  }
  for (p_Var4 = (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_groups)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    p_Var3 = p_Var4[1]._M_left;
    for (p_Var5 = p_Var4[1]._M_parent; p_Var5 != p_Var3; p_Var5 = (_Base_ptr)&p_Var5->_M_parent) {
      if (*(long **)p_Var5 != (long *)0x0) {
        (**(code **)(**(long **)p_Var5 + 8))();
      }
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
  ::clear(&(this->m_groups)._M_t);
  return;
}

Assistant:

void FieldMap::clear() {
  m_fields.clear();

  for (auto const &tagWithGroups : m_groups) {
    for (auto const &group : tagWithGroups.second) {
      delete group;
    }
  }

  m_groups.clear();
}